

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

bool __thiscall IRBuilderAsmJs::IsLoopBodyReturnIPInstr(IRBuilderAsmJs *this,Instr *instr)

{
  Opnd *this_00;
  StackSym *pSVar1;
  bool bVar2;
  RegOpnd *pRVar3;
  JitLoopBodyData *pJVar4;
  
  this_00 = instr->m_dst;
  if ((this_00 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsRegOpnd(this_00), bVar2)) {
    pRVar3 = IR::Opnd::AsRegOpnd(this_00);
    pSVar1 = pRVar3->m_sym;
    pJVar4 = GetJitLoopBodyData(this);
    return pSVar1 == pJVar4->m_loopBodyRetIPSym;
  }
  return false;
}

Assistant:

bool
IRBuilderAsmJs::IsLoopBodyReturnIPInstr(IR::Instr * instr) const
{
    IR::Opnd * dst = instr->GetDst();
    return (dst && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym == GetJitLoopBodyData().GetLoopBodyRetIPSym());
}